

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O3

void __thiscall
duckdb::WindowPartitionInput::WindowPartitionInput
          (WindowPartitionInput *this,ClientContext *context,ColumnDataCollection *inputs,
          idx_t count,vector<unsigned_long,_true> *column_ids,vector<bool,_true> *all_valid,
          ValidityMask *filter_mask,FrameStats *stats)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  
  this->context = context;
  this->inputs = inputs;
  this->count = count;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&(this->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
             &column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ::std::vector<bool,_std::allocator<bool>_>::vector
            (&(this->all_valid).super_vector<bool,_std::allocator<bool>_>,
             &all_valid->super_vector<bool,_std::allocator<bool>_>);
  this->filter_mask = filter_mask;
  iVar1 = stats->_M_elems[0].end;
  iVar2 = stats->_M_elems[1].begin;
  iVar3 = stats->_M_elems[1].end;
  (this->stats)._M_elems[0].begin = stats->_M_elems[0].begin;
  (this->stats)._M_elems[0].end = iVar1;
  (this->stats)._M_elems[1].begin = iVar2;
  (this->stats)._M_elems[1].end = iVar3;
  return;
}

Assistant:

WindowPartitionInput(ClientContext &context, const ColumnDataCollection *inputs, idx_t count,
	                     vector<column_t> &column_ids, vector<bool> &all_valid, const ValidityMask &filter_mask,
	                     const FrameStats &stats)
	    : context(context), inputs(inputs), count(count), column_ids(column_ids), all_valid(all_valid),
	      filter_mask(filter_mask), stats(stats) {
	}